

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::BamReaderPrivate::LoadNextAlignment
          (BamReaderPrivate *this,BamAlignment *alignment)

{
  uint uVar1;
  pointer pCVar2;
  uint i;
  uint uVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  uint i_1;
  BamReaderPrivate *this_00;
  bool bVar8;
  char buffer [4];
  RaiiBuffer allCharData;
  value_type local_60;
  char x [32];
  
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    buffer[lVar4] = '\0';
  }
  this_00 = (BamReaderPrivate *)&this->m_stream;
  BgzfStream::Read((BgzfStream *)this_00,buffer,4);
  (alignment->SupportData).BlockLength = (uint32_t)buffer;
  if (this->m_isBigEndian == true) {
    buffer = (char  [4])
             ((uint)buffer >> 0x18 | ((uint)buffer & 0xff0000) >> 8 | ((uint)buffer & 0xff00) << 8 |
             (int)buffer << 0x18);
    (alignment->SupportData).BlockLength = (uint32_t)buffer;
  }
  if ((buffer == (char  [4])0x0) ||
     (sVar5 = BgzfStream::Read((BgzfStream *)this_00,x,0x20), sVar5 != 0x20)) {
    bVar8 = false;
  }
  else {
    if (this->m_isBigEndian == true) {
      for (uVar6 = 0; uVar6 < 0x20; uVar6 = uVar6 + 4) {
        uVar1 = *(uint *)(x + uVar6);
        *(uint *)(x + uVar6) =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      }
    }
    *(undefined8 *)&alignment->RefID = x._0_8_;
    alignment->Bin = SUB42(x._8_4_,2);
    alignment->MapQuality = SUB42(x._8_4_,1) & 0xff;
    (alignment->SupportData).QueryNameLength = x._8_4_ & 0xff;
    alignment->AlignmentFlag = (uint)x._12_4_ >> 0x10;
    (alignment->SupportData).NumCigarOperations = x._12_4_ & 0xffff;
    (alignment->SupportData).QuerySequenceLength = x._16_4_;
    *(undefined8 *)&alignment->MateRefID = x._20_8_;
    alignment->InsertSize = x._28_4_;
    alignment->Length = x._16_4_;
    uVar6 = (ulong)((alignment->SupportData).BlockLength - 0x20);
    pcVar7 = (char *)operator_new__(uVar6);
    memset(pcVar7,0,uVar6);
    allCharData.Buffer = pcVar7;
    allCharData.NumBytes = uVar6;
    sVar5 = BgzfStream::Read((BgzfStream *)this_00,pcVar7,uVar6);
    bVar8 = sVar5 == uVar6;
    if (bVar8) {
      Tag2Cigar(this_00,alignment,&allCharData);
      std::__cxx11::string::assign((char *)&alignment->SupportData,(ulong)allCharData.Buffer);
      pcVar7 = allCharData.Buffer;
      uVar1 = (alignment->SupportData).QueryNameLength;
      pCVar2 = (alignment->CigarData).
               super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((alignment->CigarData).
          super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
          super__Vector_impl_data._M_finish != pCVar2) {
        (alignment->CigarData).
        super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
        super__Vector_impl_data._M_finish = pCVar2;
      }
      std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::reserve
                (&alignment->CigarData,(ulong)(alignment->SupportData).NumCigarOperations);
      for (uVar6 = 0; uVar6 < (alignment->SupportData).NumCigarOperations; uVar6 = uVar6 + 1) {
        uVar3 = *(uint *)(pcVar7 + uVar6 * 4 + (ulong)uVar1);
        if (this->m_isBigEndian == true) {
          uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
          *(uint *)(pcVar7 + uVar6 * 4 + (ulong)uVar1) = uVar3;
        }
        local_60.Length = uVar3 >> 4;
        local_60.Type = "MIDNSHP=X"[uVar3 & 0xf];
        std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::push_back
                  (&alignment->CigarData,&local_60);
      }
    }
    RaiiBuffer::~RaiiBuffer(&allCharData);
  }
  return bVar8;
}

Assistant:

bool BamReaderPrivate::LoadNextAlignment(BamAlignment& alignment)
{

    // read in the 'block length' value, make sure it's not zero
    char buffer[sizeof(uint32_t)];
    std::fill_n(buffer, sizeof(uint32_t), 0);
    m_stream.Read(buffer, sizeof(uint32_t));
    alignment.SupportData.BlockLength = BamTools::UnpackUnsignedInt(buffer);
    if (m_isBigEndian) BamTools::SwapEndian_32(alignment.SupportData.BlockLength);
    if (alignment.SupportData.BlockLength == 0) return false;

    // read in core alignment data, make sure the right size of data was read
    char x[Constants::BAM_CORE_SIZE];
    if (m_stream.Read(x, Constants::BAM_CORE_SIZE) != Constants::BAM_CORE_SIZE) return false;

    // swap core endian-ness if necessary
    if (m_isBigEndian) {
        for (unsigned int i = 0; i < Constants::BAM_CORE_SIZE; i += sizeof(uint32_t))
            BamTools::SwapEndian_32p(&x[i]);
    }

    // set BamAlignment 'core' and 'support' data
    alignment.RefID = BamTools::UnpackSignedInt(&x[0]);
    alignment.Position = BamTools::UnpackSignedInt(&x[4]);

    unsigned int tempValue = BamTools::UnpackUnsignedInt(&x[8]);
    alignment.Bin = tempValue >> 16;
    alignment.MapQuality = tempValue >> 8 & 0xff;
    alignment.SupportData.QueryNameLength = tempValue & 0xff;

    tempValue = BamTools::UnpackUnsignedInt(&x[12]);
    alignment.AlignmentFlag = tempValue >> 16;
    alignment.SupportData.NumCigarOperations = tempValue & 0xffff;

    alignment.SupportData.QuerySequenceLength = BamTools::UnpackUnsignedInt(&x[16]);
    alignment.MateRefID = BamTools::UnpackSignedInt(&x[20]);
    alignment.MatePosition = BamTools::UnpackSignedInt(&x[24]);
    alignment.InsertSize = BamTools::UnpackSignedInt(&x[28]);

    // set BamAlignment length
    alignment.Length = alignment.SupportData.QuerySequenceLength;

    // read in character data - make sure proper data size was read
    bool readCharDataOK = false;
    unsigned int dataLength = alignment.SupportData.BlockLength - Constants::BAM_CORE_SIZE;
    RaiiBuffer allCharData(dataLength);

    if (m_stream.Read(allCharData.Buffer, dataLength) == dataLength) {

        int OldNumCigarOperations = alignment.SupportData.NumCigarOperations;
        if (Tag2Cigar(alignment, allCharData)) dataLength -= 8 + OldNumCigarOperations * 4;

        // store 'allCharData' in supportData structure
        alignment.SupportData.AllCharData.assign((const char*)allCharData.Buffer, dataLength);

        // set success flag
        readCharDataOK = true;

        // save CIGAR ops
        // need to calculate this here so that  BamAlignment::GetEndPosition() performs correctly,
        // even when GetNextAlignmentCore() is called
        const unsigned int cigarDataOffset = alignment.SupportData.QueryNameLength;
        uint32_t* cigarData = (uint32_t*)(allCharData.Buffer + cigarDataOffset);
        CigarOp op;
        alignment.CigarData.clear();
        alignment.CigarData.reserve(alignment.SupportData.NumCigarOperations);
        for (unsigned int i = 0; i < alignment.SupportData.NumCigarOperations; ++i) {

            // swap endian-ness if necessary
            if (m_isBigEndian) BamTools::SwapEndian_32(cigarData[i]);

            // build CigarOp structure
            op.Length = (cigarData[i] >> Constants::BAM_CIGAR_SHIFT);
            op.Type = Constants::BAM_CIGAR_LOOKUP[(cigarData[i] & Constants::BAM_CIGAR_MASK)];

            // save CigarOp
            alignment.CigarData.push_back(op);
        }
    }

    // return success/failure
    return readCharDataOK;
}